

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.h
# Opt level: O2

void __thiscall
dlib::random_helpers::
mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
::twist(mersenne_twister<unsigned_int,_32,_624,_397,_31,_2567483615U,_11,_7,_2636928640U,_15,_4022730752U,_18,_3346425566U>
        *this,int block)

{
  uint uVar1;
  int j;
  long lVar2;
  
  if (block == 0) {
    for (lVar2 = -0x9c0; lVar2 != 0; lVar2 = lVar2 + 4) {
      uVar1 = *(uint *)((long)this->x + lVar2 + 0x9c4);
      *(uint *)((long)&this->i + lVar2) =
           -(uVar1 & 1) & 0x9908b0df ^
           (uVar1 & 0x7ffffffe | *(uint *)((long)this->x + lVar2 + 0x9c0) & 0x80000000) >> 1 ^
           *(uint *)((long)this->x + lVar2 + 0xff4);
    }
  }
  else if (block == 1) {
    for (lVar2 = 0; lVar2 != 0xe3; lVar2 = lVar2 + 1) {
      this->x[lVar2] =
           -(this->x[lVar2 + 0x271] & 1) & 0x9908b0df ^
           (this->x[lVar2 + 0x271] & 0x7ffffffe | this->x[lVar2 + 0x270] & 0x80000000) >> 1 ^
           this->x[lVar2 + 0x3fd];
    }
    for (lVar2 = 0x354; lVar2 != 0x4e0; lVar2 = lVar2 + 1) {
      *(uint *)((long)this + lVar2 * 4 + -0x9c4) =
           -(this->x[lVar2] & 1) & 0x9908b0df ^
           (this->x[lVar2] & 0x7ffffffe | this->x[lVar2 + -1] & 0x80000000) >> 1 ^
           *(uint *)((long)this + lVar2 * 4 + -0xd50);
    }
    this->x[0x26f] =
         -(this->x[0] & 1) & 0x9908b0df ^
         (this->x[0] & 0x7ffffffe | this->x[0x4df] & 0x80000000) >> 1 ^ this->x[0x18c];
    this->i = 0;
  }
  return;
}

Assistant:

void mersenne_twister<UIntType,w,n,m,r,a,u,s,b,t,c,l,val>::twist(
            int block
        )
        {
            const UIntType upper_mask = (~0u) << r;
            const UIntType lower_mask = ~upper_mask;

            if(block == 0) {
                for(int j = n; j < 2*n; j++) {
                    UIntType y = (x[j-n] & upper_mask) | (x[j-(n-1)] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
            } else if (block == 1) {
                // split loop to avoid costly modulo operations
                {  // extra scope for MSVC brokenness w.r.t. for scope
                    for(int j = 0; j < n-m; j++) {
                        UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                        x[j] = x[j+n+m] ^ (y >> 1) ^ (y&1 ? a : 0);
                    }
                }

                for(int j = n-m; j < n-1; j++) {
                    UIntType y = (x[j+n] & upper_mask) | (x[j+n+1] & lower_mask);
                    x[j] = x[j-(n-m)] ^ (y >> 1) ^ (y&1 ? a : 0);
                }
                // last iteration
                UIntType y = (x[2*n-1] & upper_mask) | (x[0] & lower_mask);
                x[n-1] = x[m-1] ^ (y >> 1) ^ (y&1 ? a : 0);
                i = 0;
            }
        }